

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set_heavy.cc
# Opt level: O0

size_t __thiscall google::protobuf::internal::ExtensionSet::MessageSetByteSize(ExtensionSet *this)

{
  bool bVar1;
  pointer ppVar2;
  pointer ppVar3;
  size_t sVar4;
  _Self local_28;
  _Self local_20;
  const_iterator iter;
  size_t total_size;
  ExtensionSet *this_local;
  
  iter._M_node = (_Base_ptr)0x0;
  local_20._M_node =
       (_Base_ptr)
       std::
       map<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>_>
       ::begin(&this->extensions_);
  while( true ) {
    local_28._M_node =
         (_Base_ptr)
         std::
         map<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>_>
         ::end(&this->extensions_);
    bVar1 = std::operator!=(&local_20,&local_28);
    if (!bVar1) break;
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>
             ::operator->(&local_20);
    ppVar3 = std::
             _Rb_tree_const_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>
             ::operator->(&local_20);
    sVar4 = Extension::MessageSetItemByteSize(&ppVar2->second,ppVar3->first);
    iter._M_node = (_Base_ptr)((long)&(iter._M_node)->_M_color + sVar4);
    std::
    _Rb_tree_const_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>
    ::operator++(&local_20);
  }
  return (size_t)iter._M_node;
}

Assistant:

size_t ExtensionSet::MessageSetByteSize() const {
  size_t total_size = 0;

  for (ExtensionMap::const_iterator iter = extensions_.begin();
       iter != extensions_.end(); ++iter) {
    total_size += iter->second.MessageSetItemByteSize(iter->first);
  }

  return total_size;
}